

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,TextureFormat *texformat)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"[InvalidTextureFormat]","");
  switch(*(undefined4 *)this) {
  case 0:
    pcVar2 = (char *)__return_storage_ptr__->_M_string_length;
    pcVar1 = "automatic";
    break;
  case 1:
    pcVar2 = (char *)__return_storage_ptr__->_M_string_length;
    pcVar1 = "latlong";
    break;
  case 2:
    pcVar2 = (char *)__return_storage_ptr__->_M_string_length;
    pcVar1 = "mirroedBall";
    break;
  case 3:
    pcVar2 = (char *)__return_storage_ptr__->_M_string_length;
    pcVar1 = "angular";
    break;
  default:
    goto switchD_0020bf56_default;
  }
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar2,(ulong)pcVar1);
switchD_0020bf56_default:
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const DomeLight::TextureFormat &texformat) {
  std::string s = "[InvalidTextureFormat]";

  switch (texformat) {
    case DomeLight::TextureFormat::Automatic: {
      s = "automatic";
      break;
    }
    case DomeLight::TextureFormat::Latlong: {
      s = "latlong";
      break;
    }
    case DomeLight::TextureFormat::MirroredBall: {
      s = "mirroedBall";
      break;
    }
    case DomeLight::TextureFormat::Angular: {
      s = "angular";
      break;
    }
  }

  return s;
}